

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString HexStringFrom(char value)

{
  size_t extraout_RDX;
  char in_SIL;
  undefined7 in_register_00000039;
  SimpleString *this;
  SimpleString SVar2;
  SimpleString local_30;
  size_t local_20;
  size_t size;
  SimpleString *pSStack_10;
  char value_local;
  SimpleString *result;
  size_t sVar1;
  
  this = (SimpleString *)CONCAT71(in_register_00000039,value);
  size._6_1_ = 0;
  size._7_1_ = in_SIL;
  pSStack_10 = this;
  SVar2 = StringFromFormat((char *)this,"%x",(ulong)(uint)(int)in_SIL);
  sVar1 = SVar2.bufferSize_;
  if (size._7_1_ < '\0') {
    local_20 = SimpleString::size(this);
    SimpleString::subString(&local_30,(size_t)this);
    SimpleString::operator=(this,&local_30);
    SimpleString::~SimpleString(&local_30);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString HexStringFrom(signed char value)
{
    SimpleString result = StringFromFormat("%x", value);
    if(value < 0) {
        size_t size = result.size();
        result = result.subString(size-(CPPUTEST_CHAR_BIT/4));
    }
    return result;
}